

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O1

void __thiscall CoreML::ShapeConstraint::updateHeightRange(ShapeConstraint *this,ShapeRange *other)

{
  ShapeRange *this_00;
  string err;
  ShapeRange local_80 [3];
  
  this_00 = &this->_heightRange;
  ShapeRange::intersect(local_80,this_00,other);
  (this->_heightRange)._maximum._isUnbound = local_80[0]._maximum._isUnbound;
  *(undefined7 *)&(this->_heightRange)._maximum.field_0x1 = local_80[0]._maximum._1_7_;
  (this->_heightRange)._maximum._val = local_80[0]._maximum._val;
  (this_00->_minimum)._isUnbound = local_80[0]._minimum._isUnbound;
  *(undefined7 *)&(this_00->_minimum).field_0x1 = local_80[0]._minimum._1_7_;
  (this->_heightRange)._minimum._val = local_80[0]._minimum._val;
  return;
}

Assistant:

void ShapeConstraint::updateHeightRange(const ShapeRange& other) {
    try {
        _heightRange = _heightRange.intersect(other);
    }
    catch (std::runtime_error& e) {
        std::string err = "Invalid height range in blob " + _name + ". " + e.what();
        throw std::runtime_error(err);
    }
}